

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O0

region * create_gas_cloud(level *lev,xchar x,xchar y,int radius,int damage,int duration)

{
  region *reg;
  nhrect local_34;
  int local_30;
  nhrect tmprect;
  int nrect;
  int i;
  region *cloud;
  int duration_local;
  int damage_local;
  int radius_local;
  xchar y_local;
  xchar x_local;
  level *lev_local;
  
  reg = create_region((nhrect *)0x0,0);
  local_34.ly = y - ((char)radius + -1);
  local_34.hy = y + (char)radius + -1;
  tmprect.lx = '\0';
  tmprect.ly = '\0';
  tmprect.hx = '\0';
  tmprect.hy = '\0';
  local_34.lx = x;
  local_34.hx = x;
  local_30 = radius;
  for (; (int)tmprect < local_30; tmprect = (nhrect)((int)tmprect + 1)) {
    add_rect_to_reg(reg,&local_34);
    local_34.lx = local_34.lx + -1;
    local_34.hx = local_34.hx + '\x01';
    local_34.ly = local_34.ly + '\x01';
    local_34.hy = local_34.hy + -1;
  }
  reg->ttl = (short)duration;
  if ((in_mklev == '\0') && (flags.mon_moving == '\0')) {
    reg->player_flags = reg->player_flags & 0xfd;
  }
  reg->inside_f = 0;
  reg->expire_f = 1;
  reg->arg = damage;
  reg->visible = '\x01';
  reg->effect_id = 0x40009;
  add_region(lev,reg);
  return reg;
}

Assistant:

struct region *create_gas_cloud(struct level *lev, xchar x, xchar y,
				int radius, int damage, int duration)
{
    struct region *cloud;
    int i, nrect;
    struct nhrect tmprect;

    cloud = create_region(NULL, 0);
    nrect = radius;
    tmprect.lx = x;
    tmprect.hx = x;
    tmprect.ly = y - (radius - 1);
    tmprect.hy = y + (radius - 1);
    for (i = 0; i < nrect; i++) {
	add_rect_to_reg(cloud, &tmprect);
	tmprect.lx--;
	tmprect.hx++;
	tmprect.ly++;
	tmprect.hy--;
    }
    cloud->ttl = duration;
    if (!in_mklev && !flags.mon_moving)
	set_heros_fault(cloud);		/* assume player has created it */
    cloud->inside_f = INSIDE_GAS_CLOUD;
    cloud->expire_f = EXPIRE_GAS_CLOUD;
    cloud->arg = damage;
    cloud->visible = TRUE;
    cloud->effect_id = dbuf_effect(E_MISC, E_gascloud);
    add_region(lev, cloud);
    return cloud;
}